

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O1

void compute_repair(string *in)

{
  ll_el<unsigned_int,_unsigned_int> el;
  cpair cVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  void *__s;
  ostream *poVar5;
  long *plVar6;
  cpair cVar7;
  uint64_t uVar8;
  cpair cVar9;
  cpair cVar10;
  cpair cVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  itype iVar16;
  int iVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar20 [16];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  char c;
  TP_t TP;
  text_t T;
  lf_q_t LFQ;
  ifstream ifs;
  byte local_581;
  uint local_57c;
  double local_578;
  uint local_570;
  uint uStack_56c;
  int iStack_568;
  uint uStack_564;
  uint local_560;
  text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_> local_558;
  ulong local_510;
  skippable_text<unsigned_int,_unsigned_int> local_508;
  hf_q_t local_4a8;
  lf_queue<ll_el<unsigned_int,_unsigned_int>_> local_440 [2];
  char local_238 [520];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  
  std::ifstream::ifstream(local_238,(string *)in,_S_in);
  __s = operator_new(0x400);
  memset(__s,0xff,0x400);
  std::ifstream::ifstream(local_440,(string *)in,_S_ate);
  uVar3 = std::istream::tellg();
  auVar18._0_8_ = std::ifstream::~ifstream(local_440);
  auVar18._8_56_ = extraout_var;
  auVar20 = vcvtusi2sd_avx512f(auVar18._0_16_,uVar3);
  local_578 = auVar20._0_8_;
  auVar19._0_8_ = pow(local_578,0.66);
  auVar19._8_56_ = extraout_var_00;
  uVar4 = vcvttsd2usi_avx512f(auVar19._0_16_);
  uVar13 = 2;
  if (2 < uVar4) {
    uVar13 = uVar4;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File size = ",0xc);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," characters",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"cut-off frequency = ",0x14);
  local_510 = (ulong)uVar13;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  skippable_text<unsigned_int,_unsigned_int>::skippable_text(&local_508,uVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"filling skippable text with text characters ... ",0x30);
  std::ostream::flush();
  iVar16 = 0;
  uVar12 = 0;
  uVar3 = local_508.max_symbol;
  while (local_508.max_symbol = uVar3, plVar6 = (long *)std::istream::get(local_238),
        (*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
    if (*(int *)((long)__s + (ulong)local_581 * 4) == -1) {
      *(itype *)((long)__s + (ulong)local_581 * 4) = iVar16;
      local_440[0].max_size = (itype)local_581;
      if (A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&A,(iterator)
                      A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish,&local_440[0].max_size);
      }
      else {
        *A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_440[0].max_size;
        A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             A.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar16 = iVar16 + 1;
    }
    uVar3 = *(uint *)((long)__s + (ulong)local_581 * 4);
    uVar14 = (ulong)((int)uVar12 + 1);
    local_508.T.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start[uVar12] = (unsigned_short)uVar3;
    uVar12 = uVar14;
    if (uVar3 < local_508.max_symbol) {
      uVar3 = local_508.max_symbol;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done. ",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"alphabet size is ",0x11)
  ;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"initializing and sorting text positions vector ... ",0x33);
  std::ostream::flush();
  text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::text_positions
            (&local_558,&local_508,uVar13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "done. Number of text positions containing a high-frequency pair: ",0x41);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  X = iVar16;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nSTEP 1. HIGH FREQUENCY PAIRS",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"inserting pairs in high-frequency queue ... ",0x2c);
  std::ostream::flush();
  local_4a8.H.null.P_ab = 0;
  local_4a8.H.null.L_ab = 0;
  local_4a8.H.null.F_ab = 0;
  local_4a8.H.blank = 0xffffffff;
  local_4a8.H.nullpair.first = 0xffffffff;
  local_4a8.H.nullpair.second = 0xffffffff;
  local_4a8.H.H.
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.H.H.
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.H.H.
  super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8.pairs_in_hash.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.pairs_in_hash.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.pairs_in_hash.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4a8.current_size = 0;
  local_4a8.peak_size = 0;
  local_4a8.null = 0xffffffff;
  local_4a8.NULLPAIR.first = 0xffffffff;
  local_4a8.NULLPAIR.second = 0xffffffff;
  local_4a8.min_freq = 0;
  new_high_frequency_queue(&local_4a8,&local_558,&local_508,local_510);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"done. Number of distinct high-frequency pairs = ",0x30);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Replacing high-frequency pairs ... ",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  uVar12 = 0;
  iVar15 = -1;
LAB_00107f82:
  do {
    do {
      cVar7 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::max
                        (&local_4a8);
      cVar1.second = local_4a8.NULLPAIR.second;
      cVar1.first = local_4a8.NULLPAIR.first;
      if (cVar7 == cVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done. ",6);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        auVar21._8_56_ = extraout_var_01;
        auVar21._0_8_ = extraout_XMM1_Qa;
        auVar20 = auVar21._0_16_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Peak queue size = ",0x12);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
        auVar20 = vcvtusi2sd_avx512f(auVar20,local_4a8.peak_size);
        poVar5 = std::ostream::_M_insert<double>(auVar20._0_8_ / local_578);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"n)",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\nSTEP 2. LOW FREQUENCY PAIRS",0x1c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        plVar6 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Re-computing TP array ... ",0x1a);
        std::ostream::flush();
        text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::
        fill_with_text_positions(&local_558);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sorting  TP array ... ",0x16);
        std::ostream::flush();
        text_positions<unsigned_int,_unsigned_int,_ll_el<unsigned_int,_unsigned_int>_>::cluster
                  (&local_558,0,
                   (uint)((ulong)((long)local_558.TP.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_558.TP.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Counting low-frequency pairs ... ",0x21);
        std::ostream::flush();
        if (((long)local_558.TP.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_558.TP.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start & 0x3fffffff8U) != 0) {
          uVar12 = 1;
          do {
            skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                      (&local_508,
                       local_558.TP.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar12]);
            skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                      (&local_508,
                       local_558.TP.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar12 - 1]);
            uVar12 = uVar12 + 1;
          } while (uVar12 < ((ulong)((long)local_558.TP.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_558.TP.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                            0xffffffff));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"done. Number of distict low-frequency pairs: ",0x2d);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Filling low-frequency queue ... ",0x20);
        std::ostream::flush();
        lf_queue<ll_el<unsigned_int,_unsigned_int>_>::lf_queue(local_440,uVar13 - 1);
        if (((long)local_558.TP.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_558.TP.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start & 0x3fffffff8U) != 0) {
          uVar12 = 1;
          uVar14 = 1;
          do {
            cVar9 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                              (&local_508,
                               local_558.TP.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar12]);
            cVar10 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                               (&local_508,
                                local_558.TP.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar12 - 1]);
            if (cVar9 == cVar10) {
              uVar2 = uVar14 + 1;
            }
            else {
              uVar2 = 1;
              if (1 < uVar14) {
                cVar9 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at
                                  (&local_508,
                                   local_558.TP.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar12 - 1]);
                uStack_564 = (uint)uVar14;
                iStack_568 = (int)uVar12 - uStack_564;
                local_570 = cVar9.first;
                uStack_56c = cVar9.second;
                el.L_ab = uStack_564;
                el.P_ab = iStack_568;
                el.ab.first = cVar9.first;
                el.ab.second = cVar9.second;
                el.F_ab = uStack_564;
                local_560 = uStack_564;
                lf_queue<ll_el<unsigned_int,_unsigned_int>_>::insert(local_440,el);
              }
            }
            uVar14 = uVar2;
            uVar12 = uVar12 + 1;
          } while (uVar12 < ((ulong)((long)local_558.TP.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_558.TP.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                            0xffffffff));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Replacing low-frequency pairs ... ",0x22);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
        std::ostream::put('\b');
        std::ostream::flush();
        uVar13 = local_508.non_blank_characters;
        iVar15 = -1;
        do {
          iVar17 = iVar15 + 4;
          do {
            cVar11 = lf_queue<ll_el<unsigned_int,_unsigned_int>_>::max(local_440);
            if (cVar11 == local_440[0].NULLPAIR) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done. ",6);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
              std::ostream::put('\b');
              std::ostream::flush();
              auVar22._8_56_ = extraout_var_02;
              auVar22._0_8_ = extraout_XMM1_Qa_00;
              auVar20 = auVar22._0_16_;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Peak queue size = ",0x12);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
              auVar20 = vcvtusi2sd_avx512f(auVar20,local_440[0].peak_size);
              poVar5 = std::ostream::_M_insert<double>(auVar20._0_8_ / local_578);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"n)",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
              std::ostream::put((char)poVar5);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Compressing grammar and storing it to file ... ",
                         0x2f);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
              std::ostream::put('\b');
              plVar6 = (long *)std::ostream::flush();
              std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
              std::ostream::put((char)plVar6);
              std::ostream::flush();
              if (local_508.n != 0) {
                uVar13 = 0;
                do {
                  if ((local_508.non_blank.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13 >> 6] >>
                       ((ulong)(byte)~(byte)uVar13 & 0x3f) & 1) != 0) {
                    local_57c = skippable_text<unsigned_int,_unsigned_int>::at(&local_508,uVar13);
                    if (T_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        T_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&T_vec,(iterator)
                                        T_vec.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,&local_57c);
                    }
                    else {
                      *T_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_finish = local_57c;
                      T_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish =
                           T_vec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 < local_508.n);
              }
              std::
              _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_lf_queue<ll_el<unsigned_int,_unsigned_int>_>::h_el_t>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(&local_440[0].H._M_h);
              if (local_440[0].is_sorted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                  (_Bit_type *)0x0) {
                operator_delete(local_440[0].is_sorted.super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                _M_p);
                local_440[0].is_sorted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                local_440[0].is_sorted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
                local_440[0].is_sorted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
                local_440[0].is_sorted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
                local_440[0].is_sorted.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
              }
              if (local_440[0].F_size.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_440[0].F_size.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_440[0].F_idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_440[0].F_idx.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ::~vector(&local_440[0].F);
              if (local_4a8.pairs_in_hash.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_4a8.pairs_in_hash.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
              ::~vector(&local_4a8.H.H);
              if (local_558.TP.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_558.TP.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ::~vector(&local_558.H);
              if (local_508.skips.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_508.skips.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_508.non_blank.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_508.non_blank.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_508.T.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_508.T.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete(__s);
              std::ifstream::~ifstream(local_238);
              return;
            }
            substitution_round<lf_queue<ll_el<unsigned_int,unsigned_int>>>
                      (local_440,&local_558,&local_508);
            iVar15 = 100 - (local_508.non_blank_characters * 100) / uVar13;
          } while (iVar15 <= iVar17);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
        } while( true );
      }
      uVar8 = substitution_round<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                        (&local_4a8,&local_558,&local_508);
      if (iVar15 == -1) {
        iVar15 = 0;
        uVar12 = uVar8;
        goto LAB_00107f82;
      }
      iVar17 = 100 - (int)((uVar8 * 100) / uVar12);
    } while (iVar17 <= iVar15 + 4);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    iVar15 = iVar17;
  } while( true );
}

Assistant:

void compute_repair(string in){


	//packed_gamma_file2<> out_file(out);
	//packed_gamma_file2<> out_file(out);

	/*
	 * tradeoff between low-frequency and high-freq phase:
	 *
	 * - High-freq phase will use n^(2 - 2*alpha) words of memory and process approximately n^(1-alpha) pairs
	 *   alpha should satisfy 0.5 < alpha < 1
	 *
	 * - Low-freq phase will use n^alpha words of memory
	 *
	 */
	double alpha = 0.66; // = 2/3

	/*
	 * in the low-frequency pair processing phase, insert at most n/B elements in the hash
	 */
	uint64_t B = 50;

	itype n;
	itype sigma = 0; //alphabet size

	/*
	 * Pairs with frequency greater than or equal to min_high_frequency are inserted in high-freq queue
	 */
	itype min_high_frequency = 0;
	itype lf_queue_capacity = 0;

	/*
	 * (1) INITIALIZE DATA STRUCTURES
	 */

	const itype null = ~itype(0);

	ifstream ifs(in);

	vector<itype> char_to_int(256,null);

	//count file size
	{
		ifstream file(in,ios::ate);
		n = file.tellg();
	}

	min_high_frequency = std::pow(  n, alpha  );// n^(alpha)

	min_high_frequency = min_high_frequency <2 ? 2 : min_high_frequency;

	cout << "File size = " << n << " characters"  << endl;
	cout << "cut-off frequency = " << min_high_frequency  << endl;

	itype width = 64 - __builtin_clzll(uint64_t(n));

	//largest possible high-frequency dictionary symbol
	//at most max_d <= n high-freq dictionary symbols can be created; given that min. freq of
	//a high-freq dictionary symbol is f=min_high_frequency and that every new dictionary symbol
	//introduces a blank in the text, we have the inequality max_d * f <= n  <=> max_d <= n/f
	itype max_d = 256+n/min_high_frequency;

	//cout << "Max high-frequency dictionary symbol = " << max_d << endl << endl;

	//initialize text and text positions
	text_t T(n);

	itype j = 0;

	cout << "filling skippable text with text characters ... " << flush;

	char c;

	while(ifs.get(c)){

		if(char_to_int[uint8_t(c)] == null){

			char_to_int[uint8_t(c)] = sigma;
			A.push_back(uint8_t(c));
			sigma++;

		}

		T.set(j++,char_to_int[uint8_t(c)]);

	}

	cout << "done. " << endl << endl;

	cout << "alphabet size is " << sigma  << endl << endl;

	cout << "initializing and sorting text positions vector ... " << flush;

	TP_t TP(&T,min_high_frequency);

	cout << "done. Number of text positions containing a high-frequency pair: " << TP.size() << endl;

	//next free dictionary symbol = sigma
	X =  sigma;

	cout << "\nSTEP 1. HIGH FREQUENCY PAIRS" << endl << endl;

	cout << "inserting pairs in high-frequency queue ... " << flush;

	hf_q_t HFQ;
	new_high_frequency_queue(HFQ, TP, T, min_high_frequency);

	cout << "done. Number of distinct high-frequency pairs = " << HFQ.size() << endl;

	cout << "Replacing high-frequency pairs ... " << endl;

	int last_perc = -1;
	uint64_t F = 0;//largest freq

	while(HFQ.max() != HFQ.nullpair()){

		auto f = substitution_round<hf_q_t>(HFQ, TP, T);

		if(last_perc == -1){

			F = f;

			last_perc = 0;

		}else{

			int perc = 100-(100*f)/F;

			if(perc > last_perc+4){

				last_perc = perc;
				cout << perc << "%" << endl;

			}

		}

	}

	cout << "done. " << endl;
	cout << "Peak queue size = " << HFQ.peak() << " (" << double(HFQ.peak())/double(n) << "n)" << endl;

	cout << "\nSTEP 2. LOW FREQUENCY PAIRS" << endl << endl;

	cout << "Re-computing TP array ... " << flush;

	//T.compact(); //remove blank positions
	TP.fill_with_text_positions(); //store here all remaining text positions

	cout << "done." << endl;

	cout << "Sorting  TP array ... " << flush;
	TP.cluster(); //cluster text positions by character pairs
	cout << "done." << endl;


	cout << "Counting low-frequency pairs ... " << flush;
	/*
	 * scan sorted array of text positions and count frequencies
	 *
	 * in this phase, all pairs have frequency < min_high_frequency
	 *
	 * after counting, frequencies[f] is the number of pairs with frequency equal to f
	 *
	 */
	//auto frequencies = vector<uint64_t>(min_high_frequency,0);
	uint64_t n_lf_pairs = 0; //number of low-frequency pairs

	uint64_t f = 1;
	for(uint64_t i=1;i<TP.size();++i){

		if(T.pair_starting_at(TP[i]) == T.pair_starting_at(TP[i-1])){

			f++;

		}else{

			f=1;
			n_lf_pairs++;

		}

	}
	cout << "done. Number of distict low-frequency pairs: "<< n_lf_pairs << endl;

	cout << "Filling low-frequency queue ... " << flush;

	lf_q_t LFQ(min_high_frequency-1);

	f = 1;

	using el_t = lf_q_t::el_type;

	for(uint64_t i=1;i<TP.size();++i){

		if(T.pair_starting_at(TP[i]) == T.pair_starting_at(TP[i-1])){

			f++;

		}else{

			if(f>1){

				cpair ab = T.pair_starting_at(TP[i-1]);

				assert(i>=f);
				itype P_ab = i - f;

				itype L_ab = f;

				itype F_ab = f;

				el_t el = {ab,P_ab,L_ab,F_ab};

				LFQ.insert(el);

			}

			f=1;

		}

	}

	cout << "done." << endl;

	cout << "Replacing low-frequency pairs ... " << endl;

	pair<itype,itype> replaced = {0,0};

	last_perc = -1;
	uint64_t tl = T.number_of_non_blank_characters();

	while(LFQ.max() != LFQ.nullpair()){

		auto f = substitution_round<lf_q_t>(LFQ, TP, T);

		int perc = 100-(100*T.number_of_non_blank_characters())/tl;

		if(perc>last_perc+4){

			last_perc = perc;

			cout << perc << "%" << endl;

		}

	}

	cout << "done. " << endl;
	cout << "Peak queue size = " << LFQ.peak() << " (" << double(LFQ.peak())/double(n) << "n)" << endl;

	cout << "Compressing grammar and storing it to file ... " << endl << endl;

	for(itype i=0;i<T.size();++i){

		if(not T.is_blank(i)) T_vec.push_back(T[i]);

	}

}